

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

bool Fl::option(Fl_Option opt)

{
  bool bVar1;
  int tmp;
  Fl_Preferences opt_prefs;
  Fl_Preferences prefs;
  int local_44;
  Fl_Preferences local_40;
  Fl_Preferences local_28;
  
  if (options_read_ == '\0') {
    Fl_Preferences::Fl_Preferences(&local_28,SYSTEM,"fltk.org","fltk");
    Fl_Preferences::Fl_Preferences(&local_40,&local_28,"options");
    Fl_Preferences::get(&local_40,"ArrowFocus",&local_44,0);
    options_[0] = (uchar)local_44;
    Fl_Preferences::get(&local_40,"VisibleFocus",&local_44,1);
    options_[1] = (uchar)local_44;
    Fl_Preferences::get(&local_40,"DNDText",&local_44,1);
    options_[2] = (uchar)local_44;
    Fl_Preferences::get(&local_40,"ShowTooltips",&local_44,1);
    options_[3] = (uchar)local_44;
    Fl_Preferences::get(&local_40,"FNFCUsesGTK",&local_44,1);
    options_[4] = (uchar)local_44;
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_40);
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_28);
    Fl_Preferences::Fl_Preferences(&local_28,USER,"fltk.org","fltk");
    Fl_Preferences::Fl_Preferences(&local_40,&local_28,"options");
    Fl_Preferences::get(&local_40,"ArrowFocus",&local_44,-1);
    if (-1 < local_44) {
      options_[0] = (uchar)local_44;
    }
    Fl_Preferences::get(&local_40,"VisibleFocus",&local_44,-1);
    if (-1 < local_44) {
      options_[1] = (uchar)local_44;
    }
    Fl_Preferences::get(&local_40,"DNDText",&local_44,-1);
    if (-1 < local_44) {
      options_[2] = (uchar)local_44;
    }
    Fl_Preferences::get(&local_40,"ShowTooltips",&local_44,-1);
    if (-1 < local_44) {
      options_[3] = (uchar)local_44;
    }
    Fl_Preferences::get(&local_40,"FNFCUsesGTK",&local_44,-1);
    if (-1 < local_44) {
      options_[4] = (uchar)local_44;
    }
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_40);
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_28);
    options_read_ = '\x01';
  }
  if (opt < OPTION_LAST) {
    bVar1 = options_[opt] != '\0';
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Fl::option(Fl_Option opt)
{
  if (!options_read_) {
    int tmp;
    { // first, read the system wide preferences
      Fl_Preferences prefs(Fl_Preferences::SYSTEM, "fltk.org", "fltk");
      Fl_Preferences opt_prefs(prefs, "options");
      opt_prefs.get("ArrowFocus", tmp, 0);                      // default: off
      options_[OPTION_ARROW_FOCUS] = tmp;
      //opt_prefs.get("NativeFilechooser", tmp, 1);             // default: on
      //options_[OPTION_NATIVE_FILECHOOSER] = tmp;
      //opt_prefs.get("FilechooserPreview", tmp, 1);            // default: on
      //options_[OPTION_FILECHOOSER_PREVIEW] = tmp;
      opt_prefs.get("VisibleFocus", tmp, 1);                    // default: on
      options_[OPTION_VISIBLE_FOCUS] = tmp;
      opt_prefs.get("DNDText", tmp, 1);                         // default: on
      options_[OPTION_DND_TEXT] = tmp;
      opt_prefs.get("ShowTooltips", tmp, 1);                    // default: on
      options_[OPTION_SHOW_TOOLTIPS] = tmp;
      opt_prefs.get("FNFCUsesGTK", tmp, 1);                    // default: on
      options_[OPTION_FNFC_USES_GTK] = tmp;
    }
    { // next, check the user preferences
      // override system options only, if the option is set ( >= 0 )
      Fl_Preferences prefs(Fl_Preferences::USER, "fltk.org", "fltk");
      Fl_Preferences opt_prefs(prefs, "options");
      opt_prefs.get("ArrowFocus", tmp, -1);
      if (tmp >= 0) options_[OPTION_ARROW_FOCUS] = tmp;
      //opt_prefs.get("NativeFilechooser", tmp, -1);
      //if (tmp >= 0) options_[OPTION_NATIVE_FILECHOOSER] = tmp;
      //opt_prefs.get("FilechooserPreview", tmp, -1);
      //if (tmp >= 0) options_[OPTION_FILECHOOSER_PREVIEW] = tmp;
      opt_prefs.get("VisibleFocus", tmp, -1);
      if (tmp >= 0) options_[OPTION_VISIBLE_FOCUS] = tmp;
      opt_prefs.get("DNDText", tmp, -1);
      if (tmp >= 0) options_[OPTION_DND_TEXT] = tmp;
      opt_prefs.get("ShowTooltips", tmp, -1);
      if (tmp >= 0) options_[OPTION_SHOW_TOOLTIPS] = tmp;
      opt_prefs.get("FNFCUsesGTK", tmp, -1);
      if (tmp >= 0) options_[OPTION_FNFC_USES_GTK] = tmp;
    }
    { // now, if the developer has registered this app, we could as for per-application preferences
    }
    options_read_ = 1;
  }
  if (opt<0 || opt>=OPTION_LAST)
    return false;
  return (bool)(options_[opt]!=0);
}